

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TtVerifySmallTruth(word *pTruth,int nVars)

{
  word local_20;
  word nTruth;
  word *pwStack_10;
  int nVars_local;
  word *pTruth_local;
  
  if (nVars < 6) {
    local_20 = *pTruth;
    nTruth._4_4_ = nVars;
    pwStack_10 = pTruth;
    Abc_TtNormalizeSmallTruth(&local_20,nVars);
    if (*pwStack_10 != local_20) {
      __assert_fail("*pTruth == nTruth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
    }
  }
  return;
}

Assistant:

static inline void Abc_TtVerifySmallTruth(word * pTruth, int nVars)
{
#ifndef NDEBUG
    if (nVars < 6) {
        word nTruth = *pTruth;
        Abc_TtNormalizeSmallTruth(&nTruth, nVars);
        assert(*pTruth == nTruth);
    }
#endif
}